

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadImm8(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint64_t uVar3;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t uVar4;
  uint64_t Address_01;
  uint uVar5;
  uint RegNo;
  uint uVar6;
  
  uVar6 = Insn >> 0x10 & 0xf;
  uVar3 = ARM_getFeatureBits(Inst->csh->mode);
  if (uVar6 == 0xf) {
    uVar6 = MCInst_getOpcode(Inst);
    if (uVar6 == 0x9bc) {
      uVar6 = 0x9bd;
    }
    else if (uVar6 == 0x95d) {
      uVar6 = 0x95e;
    }
    else if (uVar6 == 0x965) {
      uVar6 = 0x966;
    }
    else if (uVar6 == 0x96d) {
      uVar6 = 0x96e;
    }
    else if (uVar6 == 0x975) {
      uVar6 = 0x976;
    }
    else if (uVar6 == 0x9b8) {
      uVar6 = 0x9b9;
    }
    else {
      if (uVar6 != 0x94e) {
        return MCDisassembler_Fail;
      }
      uVar6 = 0x94f;
    }
    MCInst_setOpcode(Inst,uVar6);
    DVar2 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder);
    return DVar2;
  }
  RegNo = Insn >> 0xc & 0xf;
  uVar5 = Insn >> 9 & 1;
  if (RegNo == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x96d) {
      return MCDisassembler_Fail;
    }
    if (uVar1 == 0x965) {
      uVar1 = 0x9bc;
    }
    else if ((uVar1 != 0x95d) || (uVar1 = 0x9b5, uVar5 != 0)) goto LAB_001caa9e;
    MCInst_setOpcode(Inst,uVar1);
  }
LAB_001caa9e:
  uVar1 = MCInst_getOpcode(Inst);
  Decoder_00 = (void *)0x3;
  uVar4 = Address_00;
  if (uVar1 == 0x9b5) {
    if ((~uVar3 & 0x10000008000) != 0) {
      return MCDisassembler_Fail;
    }
  }
  else if (uVar1 != 0x9b8) {
    if (uVar1 == 0x9bc) {
      if ((uVar3 & 0x10000000000) == 0) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,(void *)0x3);
      Decoder_00 = (void *)(ulong)DVar2;
      uVar4 = extraout_RDX;
      if ((DVar2 | 2) != MCDisassembler_Success) {
        return MCDisassembler_Fail;
      }
    }
  }
  DVar2 = DecodeT2AddrModeImm8(Inst,uVar6 << 9 | uVar5 << 8 | Insn & 0xff,uVar4,Decoder_00);
  if (DVar2 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  if (DVar2 == MCDisassembler_Success) {
    return (DecodeStatus)Decoder_00;
  }
  if (DVar2 != MCDisassembler_SoftFail) {
    return MCDisassembler_Fail;
  }
  return MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeT2LoadImm8(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 9, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned add = fieldFromInstruction_4(Insn, 9, 1);

	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (U << 8);
	imm |= (Rn << 9);
	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi8:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2PLDi8:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi8:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi8:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi8:
				if (!add)
					MCInst_setOpcode(Inst, ARM_t2PLDWi8);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2PLIi8);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi8:
			break;
		case ARM_t2PLIi8:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi8:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}